

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icrs2obs.cpp
# Opt level: O2

void PrintResults(CESkyCoord *input_icrs,CESkyCoord *observed_altaz,CESkyCoord *observed_icrs,
                 CEObserver *observer,CEDate *date)

{
  double dVar1;
  CEAngle local_80;
  CEDate local_70;
  
  putchar(10);
  puts("******************************************");
  puts("* Results of ICRS -> Observed conversion *");
  puts("******************************************");
  puts("Observed Coordinates (output)");
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_70,dVar1,JD);
  (*observed_altaz->_vptr_CESkyCoord[3])(&local_80,observed_altaz,&local_70);
  CEAngle::Deg(&local_80);
  printf("    Azimuth        : %f deg\n");
  CEAngle::~CEAngle(&local_80);
  CEDate::~CEDate(&local_70);
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_70,dVar1,JD);
  (*observed_altaz->_vptr_CESkyCoord[4])(&local_80,observed_altaz,&local_70);
  CEAngle::Deg(&local_80);
  printf("    Zenith         : %+f deg\n");
  CEAngle::~CEAngle(&local_80);
  CEDate::~CEDate(&local_70);
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_70,dVar1,JD);
  (*observed_altaz->_vptr_CESkyCoord[4])(&local_80,observed_altaz,&local_70);
  dVar1 = CEAngle::Deg(&local_80);
  printf("    Altitude       : %+f deg\n",90.0 - dVar1);
  CEAngle::~CEAngle(&local_80);
  CEDate::~CEDate(&local_70);
  puts("ICRS Coordinates (input)");
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_70,dVar1,JD);
  (*input_icrs->_vptr_CESkyCoord[3])(&local_80,input_icrs,&local_70);
  CEAngle::Deg(&local_80);
  printf("    Right Ascension: %f deg\n");
  CEAngle::~CEAngle(&local_80);
  CEDate::~CEDate(&local_70);
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_70,dVar1,JD);
  (*input_icrs->_vptr_CESkyCoord[4])(&local_80,input_icrs,&local_70);
  CEAngle::Deg(&local_80);
  printf("    Declination    : %+f deg\n");
  CEAngle::~CEAngle(&local_80);
  CEDate::~CEDate(&local_70);
  (*date->_vptr_CEDate[4])(date);
  printf("    Julian Date    : %f\n");
  puts("Apparent ICRS Coordinates");
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_70,dVar1,JD);
  (*observed_icrs->_vptr_CESkyCoord[3])(&local_80,observed_icrs,&local_70);
  CEAngle::Deg(&local_80);
  printf("    Right Ascension: %f deg\n");
  CEAngle::~CEAngle(&local_80);
  CEDate::~CEDate(&local_70);
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_70,dVar1,JD);
  (*observed_icrs->_vptr_CESkyCoord[4])(&local_80,observed_icrs,&local_70);
  CEAngle::Deg(&local_80);
  printf("    Declination    : %f deg\n");
  CEAngle::~CEAngle(&local_80);
  CEDate::~CEDate(&local_70);
  puts("Observer Info");
  CEObserver::Longitude_Deg(observer);
  printf("    Longitude      : %f deg\n");
  CEObserver::Latitude_Deg(observer);
  printf("    Latitude       : %+f deg\n");
  CEObserver::Elevation_m(observer);
  printf("    Elevation      : %f meters\n");
  CEObserver::Pressure_hPa(observer);
  printf("    Pressure       : %f hPa\n");
  CEObserver::Temperature_C(observer);
  printf("    Temperature    : %f Celsius\n");
  CEObserver::RelativeHumidity(observer);
  printf("    Relative Humid.: %f\n");
  putchar(10);
  return;
}

Assistant:

void PrintResults(const CESkyCoord& input_icrs,
                  const CESkyCoord& observed_altaz,
                  const CESkyCoord& observed_icrs,
                  const CEObserver& observer,
                  const CEDate    & date)
{
    std::printf("\n") ;
    std::printf("******************************************\n") ;
    std::printf("* Results of ICRS -> Observed conversion *\n") ;
    std::printf("******************************************\n") ;
    std::printf("Observed Coordinates (output)\n") ;
    std::printf("    Azimuth        : %f deg\n", observed_altaz.XCoord().Deg()) ;
    std::printf("    Zenith         : %+f deg\n", observed_altaz.YCoord().Deg()) ;
    std::printf("    Altitude       : %+f deg\n", 90.0-observed_altaz.YCoord().Deg()) ;
    std::printf("ICRS Coordinates (input)\n") ;
    std::printf("    Right Ascension: %f deg\n", input_icrs.XCoord().Deg()) ;
    std::printf("    Declination    : %+f deg\n", input_icrs.YCoord().Deg()) ;
    std::printf("    Julian Date    : %f\n", date.JD()) ;
    std::printf("Apparent ICRS Coordinates\n");
    std::printf("    Right Ascension: %f deg\n", observed_icrs.XCoord().Deg());
    std::printf("    Declination    : %f deg\n", observed_icrs.YCoord().Deg());
    std::printf("Observer Info\n") ;
    std::printf("    Longitude      : %f deg\n", observer.Longitude_Deg()) ;
    std::printf("    Latitude       : %+f deg\n", observer.Latitude_Deg()) ;
    std::printf("    Elevation      : %f meters\n", observer.Elevation_m()) ;
    std::printf("    Pressure       : %f hPa\n", observer.Pressure_hPa()) ;
    std::printf("    Temperature    : %f Celsius\n", observer.Temperature_C()) ;
    std::printf("    Relative Humid.: %f\n", observer.RelativeHumidity()) ;
    std::printf("\n") ;
}